

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_avx2_256_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_table_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  __m256i alVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  __m256i alVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i vH;
  __m256i vH_00;
  __m256i vH_01;
  __m256i vH_02;
  short sVar20;
  int iVar21;
  uint uVar22;
  undefined4 uVar23;
  parasail_result_t *ppVar24;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *ptr;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int16_t *ptr_06;
  long lVar25;
  short sVar26;
  uint uVar27;
  ulong uVar28;
  __m256i *palVar29;
  char *pcVar30;
  int16_t iVar31;
  short sVar32;
  int iVar33;
  uint uVar34;
  short sVar35;
  int iVar36;
  ulong uVar37;
  long lVar38;
  char *__format;
  long lVar39;
  undefined2 uVar40;
  int32_t t;
  ulong uVar41;
  int seglen;
  ulong size;
  int32_t d;
  int iVar42;
  bool bVar43;
  undefined2 uVar44;
  undefined2 uVar45;
  undefined2 uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar52 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar57 [16];
  undefined1 auVar55 [32];
  __m256i alVar56;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 in_ZMM15 [64];
  __m256i_16_t h;
  undefined8 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbec;
  __m256i *palVar65;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_2a0 [32];
  undefined1 local_260 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar30 = "profile";
  }
  else {
    pvVar6 = (profile->profile16).score;
    if (pvVar6 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar30 = "profile->profile16.score";
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar30 = "profile->matrix";
      }
      else {
        uVar27 = profile->s1Len;
        if ((int)uVar27 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar30 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar30 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar30 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar30 = "open";
        }
        else {
          if (-1 < gap) {
            uVar34 = uVar27 - 1;
            size = (ulong)uVar27 + 0xf >> 4;
            uVar10 = uVar34 / size;
            uVar11 = (ulong)uVar34 % size;
            pvVar8 = (profile->profile16).matches;
            pvVar9 = (profile->profile16).similar;
            iVar42 = -open;
            iVar21 = ppVar7->min;
            iVar33 = -iVar21;
            if (iVar21 != iVar42 && SBORROW4(iVar21,iVar42) == iVar21 + open < 0) {
              iVar33 = open;
            }
            sVar20 = 0x7ffe - (short)ppVar7->max;
            ppVar24 = parasail_result_new_table3((uint)((ulong)uVar27 + 0xf) & 0x7ffffff0,s2Len);
            if (ppVar24 != (parasail_result_t *)0x0) {
              local_2a0._0_4_ = open;
              ppVar24->flag = ppVar24->flag | 0x10230401;
              b = parasail_memalign___m256i(0x20,size);
              b_00 = parasail_memalign___m256i(0x20,size);
              b_01 = parasail_memalign___m256i(0x20,size);
              b_02 = parasail_memalign___m256i(0x20,size);
              ptr = parasail_memalign___m256i(0x20,size);
              b_03 = parasail_memalign___m256i(0x20,size);
              b_04 = parasail_memalign___m256i(0x20,size);
              b_05 = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              ptr_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              ptr_03 = parasail_memalign___m256i(0x20,size);
              ptr_04 = parasail_memalign___m256i(0x20,size);
              ptr_05 = parasail_memalign___m256i(0x20,size);
              ptr_06 = parasail_memalign_int16_t(0x20,(ulong)(s2Len + 1));
              auVar54._8_8_ = 0;
              auVar54._0_8_ = b;
              auVar57._8_8_ = 0;
              auVar57._0_8_ = b_00;
              auVar54 = vpunpcklqdq_avx(auVar54,auVar57);
              auVar47._8_8_ = 0;
              auVar47._0_8_ = b_01;
              auVar52._8_8_ = 0;
              auVar52._0_8_ = b_02;
              auVar57 = vpunpcklqdq_avx(auVar47,auVar52);
              auVar47 = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar54;
              auVar52 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar57;
              auVar53._8_8_ = 0;
              auVar53._0_8_ = ptr;
              auVar58._8_8_ = 0;
              auVar58._0_8_ = b_03;
              auVar54 = vpunpcklqdq_avx(auVar53,auVar58);
              auVar59._8_8_ = 0;
              auVar59._0_8_ = b_04;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = b_05;
              auVar57 = vpunpcklqdq_avx(auVar59,auVar60);
              auVar54 = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar54;
              auVar57 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar57;
              auVar48._0_8_ = -(ulong)(auVar47._0_8_ == 0);
              auVar48._8_8_ = -(ulong)(auVar47._8_8_ == 0);
              auVar48._16_8_ = -(ulong)(auVar52._0_8_ == 0);
              auVar48._24_8_ = -(ulong)(auVar52._8_8_ == 0);
              auVar55._0_8_ = -(ulong)(auVar54._0_8_ == 0);
              auVar55._8_8_ = -(ulong)(auVar54._8_8_ == 0);
              auVar55._16_8_ = -(ulong)(auVar57._0_8_ == 0);
              auVar55._24_8_ = -(ulong)(auVar57._8_8_ == 0);
              auVar48 = vpackssdw_avx2(auVar48,auVar55);
              if (((((ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0) &&
                    ptr_05 != (__m256i *)0x0) &&
                   ((ptr_01 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0) &&
                   ptr_02 != (__m256i *)0x0)) && ptr_06 != (int16_t *)0x0) &&
                  ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar48 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar48 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar48 >> 0x7f,0) == '\0') &&
                     (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar48 >> 0xbf,0) == '\0') &&
                   (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar48[0x1f])) {
                iVar21 = s2Len + -1;
                uVar44 = (undefined2)open;
                uVar45 = (undefined2)gap;
                uVar46 = (undefined2)(iVar33 - 0x7fffU);
                seglen = (int)size;
                auVar49._0_2_ = (undefined2)size;
                auVar49._2_2_ = auVar49._0_2_;
                auVar49._4_2_ = auVar49._0_2_;
                auVar49._6_2_ = auVar49._0_2_;
                auVar49._8_2_ = auVar49._0_2_;
                auVar49._10_2_ = auVar49._0_2_;
                auVar49._12_2_ = auVar49._0_2_;
                auVar49._14_2_ = auVar49._0_2_;
                auVar49._16_2_ = auVar49._0_2_;
                auVar49._18_2_ = auVar49._0_2_;
                auVar49._20_2_ = auVar49._0_2_;
                auVar49._22_2_ = auVar49._0_2_;
                auVar49._24_2_ = auVar49._0_2_;
                auVar49._26_2_ = auVar49._0_2_;
                auVar49._28_2_ = auVar49._0_2_;
                auVar49._30_2_ = auVar49._0_2_;
                auVar55 = vperm2i128_avx2(auVar49,auVar49,0x28);
                auVar50._0_2_ = (undefined2)-(seglen * gap);
                auVar50._2_2_ = auVar50._0_2_;
                auVar50._4_2_ = auVar50._0_2_;
                auVar50._6_2_ = auVar50._0_2_;
                auVar50._8_2_ = auVar50._0_2_;
                auVar50._10_2_ = auVar50._0_2_;
                auVar50._12_2_ = auVar50._0_2_;
                auVar50._14_2_ = auVar50._0_2_;
                auVar50._16_2_ = auVar50._0_2_;
                auVar50._18_2_ = auVar50._0_2_;
                auVar50._20_2_ = auVar50._0_2_;
                auVar50._22_2_ = auVar50._0_2_;
                auVar50._24_2_ = auVar50._0_2_;
                auVar50._26_2_ = auVar50._0_2_;
                auVar50._28_2_ = auVar50._0_2_;
                auVar50._30_2_ = auVar50._0_2_;
                auVar48 = vpand_avx2(auVar50,_DAT_008a5920);
                auVar50 = ZEXT432(iVar33 - 0x7fffU & 0xffff);
                auVar48 = vpaddsw_avx2(auVar50,auVar48);
                alVar12[1]._0_4_ = iVar33;
                alVar12[0] = in_stack_fffffffffffffbe0;
                alVar12[1]._4_4_ = in_stack_fffffffffffffbec;
                alVar12[2] = (longlong)ptr_06;
                alVar12[3] = (longlong)b_04;
                parasail_memset___m256i(b_03,alVar12,size);
                alVar17[1]._0_4_ = iVar33;
                alVar17[0] = in_stack_fffffffffffffbe0;
                alVar17[1]._4_4_ = in_stack_fffffffffffffbec;
                alVar17[2] = (longlong)ptr_06;
                alVar17[3] = (longlong)b_04;
                parasail_memset___m256i(b_04,alVar17,size);
                alVar1[1]._0_4_ = iVar33;
                alVar1[0] = in_stack_fffffffffffffbe0;
                alVar1[1]._4_4_ = in_stack_fffffffffffffbec;
                alVar1[2] = (longlong)ptr_06;
                alVar1[3] = (longlong)b_04;
                parasail_memset___m256i(b_05,alVar1,size);
                alVar2[1]._0_4_ = iVar33;
                alVar2[0] = in_stack_fffffffffffffbe0;
                alVar2[1]._4_4_ = in_stack_fffffffffffffbec;
                alVar2[2] = (longlong)ptr_06;
                alVar2[3] = (longlong)b_04;
                parasail_memset___m256i(b,alVar2,size);
                c[1]._0_4_ = iVar33;
                c[0] = in_stack_fffffffffffffbe0;
                c[1]._4_4_ = in_stack_fffffffffffffbec;
                c[2] = (longlong)ptr_06;
                c[3] = (longlong)b_04;
                parasail_memset___m256i(b_00,c,size);
                c_00[1]._0_4_ = iVar33;
                c_00[0] = in_stack_fffffffffffffbe0;
                c_00[1]._4_4_ = in_stack_fffffffffffffbec;
                c_00[2] = (longlong)ptr_06;
                c_00[3] = (longlong)b_04;
                parasail_memset___m256i(b_01,c_00,size);
                c_01[1]._0_4_ = iVar33;
                c_01[0] = in_stack_fffffffffffffbe0;
                c_01[1]._4_4_ = in_stack_fffffffffffffbec;
                c_01[2] = (longlong)ptr_06;
                c_01[3] = (longlong)b_04;
                parasail_memset___m256i(b_02,c_01,size);
                auVar13._2_2_ = uVar44;
                auVar13._0_2_ = uVar44;
                auVar13._4_2_ = uVar44;
                auVar13._6_2_ = uVar44;
                auVar13._8_2_ = uVar44;
                auVar13._10_2_ = uVar44;
                auVar13._12_2_ = uVar44;
                auVar13._14_2_ = uVar44;
                auVar13._16_2_ = uVar44;
                auVar13._18_2_ = uVar44;
                auVar13._20_2_ = uVar44;
                auVar13._22_2_ = uVar44;
                auVar13._24_2_ = uVar44;
                auVar13._26_2_ = uVar44;
                auVar13._28_2_ = uVar44;
                auVar13._30_2_ = uVar44;
                alVar17 = (__m256i)vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar13);
                uVar23 = 0;
                alVar56[1]._0_2_ = 1;
                alVar56[0] = 0x1000100010001;
                alVar56[1]._2_2_ = 1;
                alVar56[1]._4_2_ = 1;
                alVar56[1]._6_2_ = 1;
                alVar56[2]._0_2_ = 1;
                alVar56[2]._2_2_ = 1;
                alVar56[2]._4_2_ = 1;
                alVar56[2]._6_2_ = 1;
                alVar56[3]._0_2_ = 1;
                alVar56[3]._2_2_ = 1;
                alVar56[3]._4_2_ = 1;
                alVar56[3]._6_2_ = 1;
                uVar22 = seglen - 1;
                alVar12 = alVar56;
                for (uVar27 = uVar22; -1 < (int)uVar27; uVar27 = uVar27 - 1) {
                  ptr_04[uVar27] = alVar17;
                  ptr_05[uVar27] = alVar12;
                  auVar19._2_2_ = uVar45;
                  auVar19._0_2_ = uVar45;
                  auVar19._4_2_ = uVar45;
                  auVar19._6_2_ = uVar45;
                  auVar19._8_2_ = uVar45;
                  auVar19._10_2_ = uVar45;
                  auVar19._12_2_ = uVar45;
                  auVar19._14_2_ = uVar45;
                  auVar19._16_2_ = uVar45;
                  auVar19._18_2_ = uVar45;
                  auVar19._20_2_ = uVar45;
                  auVar19._22_2_ = uVar45;
                  auVar19._24_2_ = uVar45;
                  auVar19._26_2_ = uVar45;
                  auVar19._28_2_ = uVar45;
                  auVar19._30_2_ = uVar45;
                  alVar17 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar17,auVar19);
                  alVar12 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar12,
                                                  (undefined1  [32])alVar56);
                }
                iVar33 = iVar42;
                for (uVar28 = 0; uVar28 != size; uVar28 = uVar28 + 1) {
                  iVar36 = iVar33;
                  for (lVar39 = 0; lVar39 != 0x10; lVar39 = lVar39 + 1) {
                    uVar40 = 0x8000;
                    if (-0x8000 < iVar36) {
                      uVar40 = (undefined2)iVar36;
                    }
                    *(undefined2 *)((long)&local_80 + lVar39 * 2) = uVar40;
                    iVar36 = iVar36 - seglen * gap;
                  }
                  palVar65 = ptr + uVar28;
                  (*palVar65)[0] = local_80;
                  (*palVar65)[1] = lStack_78;
                  (*palVar65)[2] = lStack_70;
                  (*palVar65)[3] = lStack_68;
                  iVar33 = iVar33 - gap;
                }
                *ptr_06 = 0;
                for (uVar28 = 1; s2Len + 1 != uVar28; uVar28 = uVar28 + 1) {
                  iVar31 = -0x8000;
                  if (-0x8000 < iVar42) {
                    iVar31 = (int16_t)iVar42;
                  }
                  ptr_06[uVar28] = iVar31;
                  iVar42 = iVar42 - gap;
                }
                palVar29 = b_04 + uVar22;
                auVar55 = vpalignr_avx2(auVar49,auVar55,0xe);
                lVar39 = size << 5;
                local_200._2_2_ = sVar20;
                local_200._0_2_ = sVar20;
                local_200._4_2_ = sVar20;
                local_200._6_2_ = sVar20;
                local_200._10_2_ = sVar20;
                local_200._8_2_ = sVar20;
                local_200._12_2_ = sVar20;
                local_200._14_2_ = sVar20;
                local_200._18_2_ = sVar20;
                local_200._16_2_ = sVar20;
                local_200._20_2_ = sVar20;
                local_200._22_2_ = sVar20;
                local_200._26_2_ = sVar20;
                local_200._24_2_ = sVar20;
                local_200._28_2_ = sVar20;
                local_200._30_2_ = sVar20;
                local_220._2_2_ = uVar46;
                local_220._0_2_ = uVar46;
                local_220._4_2_ = uVar46;
                local_220._6_2_ = uVar46;
                local_220._10_2_ = uVar46;
                local_220._8_2_ = uVar46;
                local_220._12_2_ = uVar46;
                local_220._14_2_ = uVar46;
                local_220._18_2_ = uVar46;
                local_220._16_2_ = uVar46;
                local_220._20_2_ = uVar46;
                local_220._22_2_ = uVar46;
                local_220._26_2_ = uVar46;
                local_220._24_2_ = uVar46;
                local_220._28_2_ = uVar46;
                local_220._30_2_ = uVar46;
                uVar28 = 0;
                palVar65 = b_04;
                while (uVar37 = uVar28, uVar37 != (uint)s2Len) {
                  alVar12 = ptr[uVar22];
                  alVar17 = b_03[uVar22];
                  alVar1 = *palVar29;
                  alVar2 = b_05[uVar22];
                  auVar54 = alVar12._0_16_;
                  auVar61._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar54;
                  auVar61._16_16_ = ZEXT116(0) * alVar12._16_16_ + ZEXT116(1) * auVar54;
                  auVar13 = vpalignr_avx2((undefined1  [32])alVar12,auVar61,0xe);
                  auVar49 = vperm2i128_avx2((undefined1  [32])alVar17,(undefined1  [32])alVar17,0x28
                                           );
                  auVar49 = vpalignr_avx2((undefined1  [32])alVar17,auVar49,0xe);
                  auVar19 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                  auVar19 = vpalignr_avx2((undefined1  [32])alVar1,auVar19,0xe);
                  auVar61 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                  auVar61 = vpalignr_avx2((undefined1  [32])alVar2,auVar61,0xe);
                  auVar54 = vpinsrw_avx(auVar13._0_16_,(uint)(ushort)ptr_06[uVar37],0);
                  auVar51 = vpblendd_avx2(auVar13,ZEXT1632(auVar54),0xf);
                  lVar25 = (long)(ppVar7->mapper[(byte)s2[uVar37]] * (int)size) * 0x20;
                  auVar16._2_2_ = uVar46;
                  auVar16._0_2_ = uVar46;
                  auVar16._4_2_ = uVar46;
                  auVar16._6_2_ = uVar46;
                  auVar16._8_2_ = uVar46;
                  auVar16._10_2_ = uVar46;
                  auVar16._12_2_ = uVar46;
                  auVar16._14_2_ = uVar46;
                  auVar16._16_2_ = uVar46;
                  auVar16._18_2_ = uVar46;
                  auVar16._20_2_ = uVar46;
                  auVar16._22_2_ = uVar46;
                  auVar16._24_2_ = uVar46;
                  auVar16._26_2_ = uVar46;
                  auVar16._28_2_ = uVar46;
                  auVar16._30_2_ = uVar46;
                  auVar13 = vpsubsw_avx2(auVar16,(undefined1  [32])*ptr_04);
                  local_3a0 = ZEXT1632(ZEXT816(0));
                  local_380 = ZEXT1632(ZEXT816(0));
                  local_360 = ZEXT1632(ZEXT816(0));
                  for (lVar38 = 0; auVar64 = in_ZMM15._0_32_, lVar39 != lVar38;
                      lVar38 = lVar38 + 0x20) {
                    auVar3 = *(undefined1 (*) [32])((long)*ptr + lVar38);
                    auVar4 = *(undefined1 (*) [32])((long)*b_03 + lVar38);
                    auVar62 = *(undefined1 (*) [32])((long)*b_04 + lVar38);
                    auVar5 = *(undefined1 (*) [32])((long)*b_05 + lVar38);
                    auVar13 = vpaddsw_avx2(auVar13,*(undefined1 (*) [32])((long)*ptr_04 + lVar38));
                    auVar15 = vpcmpgtw_avx2(auVar13,auVar16);
                    local_3a0 = vpblendvb_avx2(local_3a0,auVar64,auVar15);
                    local_380 = vpblendvb_avx2(local_380,local_2a0,auVar15);
                    auVar64 = vpaddsw_avx2(local_260,*(undefined1 (*) [32])((long)*ptr_05 + lVar38))
                    ;
                    local_360 = vpblendvb_avx2(local_360,auVar64,auVar15);
                    auVar64._2_2_ = uVar44;
                    auVar64._0_2_ = uVar44;
                    auVar64._4_2_ = uVar44;
                    auVar64._6_2_ = uVar44;
                    auVar64._8_2_ = uVar44;
                    auVar64._10_2_ = uVar44;
                    auVar64._12_2_ = uVar44;
                    auVar64._14_2_ = uVar44;
                    auVar64._16_2_ = uVar44;
                    auVar64._18_2_ = uVar44;
                    auVar64._20_2_ = uVar44;
                    auVar64._22_2_ = uVar44;
                    auVar64._24_2_ = uVar44;
                    auVar64._26_2_ = uVar44;
                    auVar64._28_2_ = uVar44;
                    auVar64._30_2_ = uVar44;
                    auVar63 = vpsubsw_avx2(auVar3,auVar64);
                    auVar15._2_2_ = uVar45;
                    auVar15._0_2_ = uVar45;
                    auVar15._4_2_ = uVar45;
                    auVar15._6_2_ = uVar45;
                    auVar15._8_2_ = uVar45;
                    auVar15._10_2_ = uVar45;
                    auVar15._12_2_ = uVar45;
                    auVar15._14_2_ = uVar45;
                    auVar15._16_2_ = uVar45;
                    auVar15._18_2_ = uVar45;
                    auVar15._20_2_ = uVar45;
                    auVar15._22_2_ = uVar45;
                    auVar15._24_2_ = uVar45;
                    auVar15._26_2_ = uVar45;
                    auVar15._28_2_ = uVar45;
                    auVar15._30_2_ = uVar45;
                    auVar18 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*b + lVar38),auVar15);
                    auVar64 = vpcmpgtw_avx2(auVar63,auVar18);
                    auVar15 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + lVar38),auVar4,
                                             auVar64);
                    auVar14 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + lVar38),auVar62,
                                             auVar64);
                    auVar18 = vpmaxsw_avx2(auVar63,auVar18);
                    auVar63._8_2_ = 1;
                    auVar63._0_8_ = 0x1000100010001;
                    auVar63._10_2_ = 1;
                    auVar63._12_2_ = 1;
                    auVar63._14_2_ = 1;
                    auVar63._16_2_ = 1;
                    auVar63._18_2_ = 1;
                    auVar63._20_2_ = 1;
                    auVar63._22_2_ = 1;
                    auVar63._24_2_ = 1;
                    auVar63._26_2_ = 1;
                    auVar63._28_2_ = 1;
                    auVar63._30_2_ = 1;
                    auVar64 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + lVar38),auVar5,
                                             auVar64);
                    auVar61 = vpaddsw_avx2(auVar63,auVar61);
                    auVar64 = vpaddsw_avx2(auVar63,auVar64);
                    auVar51 = vpaddsw_avx2(auVar51,*(undefined1 (*) [32])
                                                    ((long)pvVar6 + lVar38 + lVar25));
                    auVar49 = vpaddsw_avx2(auVar49,*(undefined1 (*) [32])
                                                    ((long)pvVar8 + lVar38 + lVar25));
                    auVar19 = vpaddsw_avx2(auVar19,*(undefined1 (*) [32])
                                                    ((long)pvVar9 + lVar38 + lVar25));
                    auVar16 = vpmaxsw_avx2(auVar13,auVar16);
                    auVar63 = vpcmpgtw_avx2(auVar18,auVar51);
                    *(undefined1 (*) [32])((long)*b + lVar38) = auVar18;
                    *(undefined1 (*) [32])((long)*b_00 + lVar38) = auVar15;
                    auVar13 = vpblendvb_avx2(auVar49,auVar15,auVar63);
                    in_ZMM15 = ZEXT3264(auVar13);
                    *(undefined1 (*) [32])((long)*b_01 + lVar38) = auVar14;
                    local_2a0 = vpblendvb_avx2(auVar19,auVar14,auVar63);
                    local_260 = vpblendvb_avx2(auVar61,auVar64,auVar63);
                    *(undefined1 (*) [32])((long)*b_02 + lVar38) = auVar64;
                    *(undefined1 (*) [32])((long)*ptr + lVar38) = auVar51;
                    *(undefined1 (*) [32])((long)*b_03 + lVar38) = auVar49;
                    *(undefined1 (*) [32])((long)*b_04 + lVar38) = auVar19;
                    auVar13 = vpmaxsw_avx2(auVar18,auVar51);
                    *(undefined1 (*) [32])((long)*b_05 + lVar38) = auVar61;
                    auVar49 = auVar4;
                    auVar19 = auVar62;
                    auVar51 = auVar3;
                    auVar61 = auVar5;
                  }
                  auVar49 = vperm2i128_avx2(auVar64,auVar64,0x28);
                  auVar49 = vpalignr_avx2(auVar64,auVar49,0xe);
                  auVar19 = vperm2i128_avx2(local_2a0,local_2a0,0x28);
                  local_2a0 = vpalignr_avx2(local_2a0,auVar19,0xe);
                  auVar19 = vperm2i128_avx2(local_260,local_260,0x28);
                  local_260 = vpalignr_avx2(local_260,auVar19,0xe);
                  auVar51._0_16_ = ZEXT116(0) * auVar13._0_16_ + ZEXT116(1) * auVar19._0_16_;
                  auVar51._16_16_ = ZEXT116(0) * auVar19._16_16_ + ZEXT116(1) * auVar13._0_16_;
                  auVar13 = vpalignr_avx2(auVar13,auVar51,0xe);
                  auVar54 = vpinsrw_avx(auVar13._0_16_,(uint)(ushort)ptr_06[uVar37 + 1],0);
                  auVar64 = vpblendd_avx2(auVar13,ZEXT1632(auVar54),0xf);
                  auVar13 = vpaddsw_avx2(auVar64,(undefined1  [32])*ptr_04);
                  auVar51 = vpcmpgtw_avx2(auVar16,auVar13);
                  auVar16 = vpmaxsw_avx2(auVar16,auVar13);
                  auVar19 = vpblendvb_avx2(auVar49,local_3a0,auVar51);
                  auVar61 = vpblendvb_avx2(local_2a0,local_380,auVar51);
                  auVar13 = vpaddsw_avx2(local_260,(undefined1  [32])*ptr_05);
                  auVar13 = vpblendvb_avx2(auVar13,local_360,auVar51);
                  iVar33 = 0xe;
                  size = CONCAT44(uVar23,seglen);
                  while( true ) {
                    auVar51 = vperm2i128_avx2(auVar16,auVar16,0x28);
                    auVar3 = vperm2i128_avx2(auVar19,auVar19,0x28);
                    auVar4 = vperm2i128_avx2(auVar61,auVar61,0x28);
                    auVar62 = vperm2i128_avx2(auVar13,auVar13,0x28);
                    bVar43 = iVar33 == 0;
                    iVar33 = iVar33 + -1;
                    if (bVar43) break;
                    auVar51 = vpalignr_avx2(auVar16,auVar51,0xe);
                    auVar51 = vpaddsw_avx2(auVar51,auVar48);
                    auVar5 = vpcmpgtw_avx2(auVar16,auVar51);
                    auVar3 = vpalignr_avx2(auVar19,auVar3,0xe);
                    auVar19 = vpblendvb_avx2(auVar3,auVar19,auVar5);
                    auVar16 = vpmaxsw_avx2(auVar16,auVar51);
                    auVar51 = vpalignr_avx2(auVar61,auVar4,0xe);
                    auVar61 = vpblendvb_avx2(auVar51,auVar61,auVar5);
                    auVar51 = vpalignr_avx2(auVar13,auVar62,0xe);
                    auVar51 = vpaddsw_avx2(auVar51,auVar55);
                    auVar13 = vpblendvb_avx2(auVar51,auVar13,auVar5);
                  }
                  auVar16 = vpalignr_avx2(auVar16,auVar51,0xe);
                  local_160 = vpaddsw_avx2(auVar16,auVar50);
                  auVar16 = vpcmpgtw_avx2(local_160,auVar64);
                  local_180 = vpmaxsw_avx2(local_160,auVar64);
                  local_120 = vpalignr_avx2(auVar19,auVar3,0xe);
                  local_3a0 = vpblendvb_avx2(auVar49,local_120,auVar16);
                  local_140 = vpalignr_avx2(auVar61,auVar4,0xe);
                  local_360 = vpblendvb_avx2(local_2a0,local_140,auVar16);
                  local_1a0 = vpalignr_avx2(auVar13,auVar62,0xe);
                  local_380 = vpblendvb_avx2(local_260,local_1a0,auVar16);
                  lVar25 = 0;
                  uVar41 = 0;
                  while (in_ZMM15 = ZEXT3264(auVar49), uVar28 = uVar37 + 1, size != uVar41) {
                    auVar3._2_2_ = uVar44;
                    auVar3._0_2_ = uVar44;
                    auVar3._4_2_ = uVar44;
                    auVar3._6_2_ = uVar44;
                    auVar3._8_2_ = uVar44;
                    auVar3._10_2_ = uVar44;
                    auVar3._12_2_ = uVar44;
                    auVar3._14_2_ = uVar44;
                    auVar3._16_2_ = uVar44;
                    auVar3._18_2_ = uVar44;
                    auVar3._20_2_ = uVar44;
                    auVar3._22_2_ = uVar44;
                    auVar3._24_2_ = uVar44;
                    auVar3._26_2_ = uVar44;
                    auVar3._28_2_ = uVar44;
                    auVar3._30_2_ = uVar44;
                    auVar61 = vpsubsw_avx2(local_180,auVar3);
                    auVar4._2_2_ = uVar45;
                    auVar4._0_2_ = uVar45;
                    auVar4._4_2_ = uVar45;
                    auVar4._6_2_ = uVar45;
                    auVar4._8_2_ = uVar45;
                    auVar4._10_2_ = uVar45;
                    auVar4._12_2_ = uVar45;
                    auVar4._14_2_ = uVar45;
                    auVar4._16_2_ = uVar45;
                    auVar4._18_2_ = uVar45;
                    auVar4._20_2_ = uVar45;
                    auVar4._22_2_ = uVar45;
                    auVar4._24_2_ = uVar45;
                    auVar4._26_2_ = uVar45;
                    auVar4._28_2_ = uVar45;
                    auVar4._30_2_ = uVar45;
                    auVar16 = vpsubsw_avx2(local_160,auVar4);
                    auVar13 = vpcmpgtw_avx2(auVar61,auVar16);
                    local_120 = vpblendvb_avx2(local_120,local_3a0,auVar13);
                    local_140 = vpblendvb_avx2(local_140,local_360,auVar13);
                    auVar19 = vpblendvb_avx2(local_1a0,local_380,auVar13);
                    auVar13 = *(undefined1 (*) [32])((long)*ptr + lVar25);
                    auVar62._8_2_ = 1;
                    auVar62._0_8_ = 0x1000100010001;
                    auVar62._10_2_ = 1;
                    auVar62._12_2_ = 1;
                    auVar62._14_2_ = 1;
                    auVar62._16_2_ = 1;
                    auVar62._18_2_ = 1;
                    auVar62._20_2_ = 1;
                    auVar62._22_2_ = 1;
                    auVar62._24_2_ = 1;
                    auVar62._26_2_ = 1;
                    auVar62._28_2_ = 1;
                    auVar62._30_2_ = 1;
                    local_160 = vpmaxsw_avx2(auVar61,auVar16);
                    auVar61 = vpmaxsw_avx2(auVar13,*(undefined1 (*) [32])((long)*b + lVar25));
                    local_180 = vpmaxsw_avx2(auVar61,local_160);
                    auVar51 = vpcmpgtw_avx2(auVar61,local_160);
                    auVar61 = vpblendvb_avx2(local_120,*(undefined1 (*) [32])((long)*b_00 + lVar25),
                                             auVar51);
                    auVar16 = vpcmpeqw_avx2(local_180,auVar13);
                    local_3a0 = vpblendvb_avx2(auVar61,*(undefined1 (*) [32])((long)*b_03 + lVar25),
                                               auVar16);
                    auVar13 = vpblendvb_avx2(local_140,*(undefined1 (*) [32])((long)*b_01 + lVar25),
                                             auVar51);
                    local_360 = vpblendvb_avx2(auVar13,*(undefined1 (*) [32])((long)*b_04 + lVar25),
                                               auVar16);
                    local_1a0 = vpaddsw_avx2(auVar19,auVar62);
                    auVar13 = vpblendvb_avx2(local_1a0,*(undefined1 (*) [32])((long)*b_02 + lVar25),
                                             auVar51);
                    local_380 = vpblendvb_avx2(auVar13,*(undefined1 (*) [32])((long)*b_05 + lVar25),
                                               auVar16);
                    *(undefined1 (*) [32])((long)*ptr + lVar25) = local_180;
                    *(undefined1 (*) [32])((long)*b_03 + lVar25) = local_3a0;
                    *(undefined1 (*) [32])((long)*b_04 + lVar25) = local_360;
                    *(undefined1 (*) [32])((long)*b_05 + lVar25) = local_380;
                    local_200 = vpminsw_avx2(local_200,local_180);
                    auVar13 = vpmaxsw_avx2(local_180,local_220);
                    auVar13 = vpmaxsw_avx2(local_3a0,auVar13);
                    auVar19 = vpmaxsw_avx2(local_360,local_380);
                    local_220 = vpmaxsw_avx2(auVar13,auVar19);
                    t = (int32_t)uVar41;
                    d = (int32_t)uVar37;
                    vH[1]._0_4_ = seglen;
                    vH[0] = in_stack_fffffffffffffbe0;
                    vH[1]._4_4_ = uVar23;
                    vH[2] = (longlong)ptr_06;
                    vH[3] = (longlong)palVar65;
                    arr_store_si256(*((ppVar24->field_4).trace)->trace_del_table,vH,t,seglen,d,s2Len
                                   );
                    vH_00[1]._0_4_ = seglen;
                    vH_00[0] = in_stack_fffffffffffffbe0;
                    vH_00[1]._4_4_ = uVar23;
                    vH_00[2] = (longlong)ptr_06;
                    vH_00[3] = (longlong)palVar65;
                    arr_store_si256(*(int **)((long)((ppVar24->field_4).trace)->trace_del_table + 8)
                                    ,vH_00,t,seglen,d,s2Len);
                    vH_01[1]._0_4_ = seglen;
                    vH_01[0] = in_stack_fffffffffffffbe0;
                    vH_01[1]._4_4_ = uVar23;
                    vH_01[2] = (longlong)ptr_06;
                    vH_01[3] = (longlong)palVar65;
                    arr_store_si256(*(int **)((long)((ppVar24->field_4).trace)->trace_del_table +
                                             0x10),vH_01,t,seglen,d,s2Len);
                    vH_02[1]._0_4_ = seglen;
                    vH_02[0] = in_stack_fffffffffffffbe0;
                    vH_02[1]._4_4_ = uVar23;
                    vH_02[2] = (longlong)ptr_06;
                    vH_02[3] = (longlong)palVar65;
                    b_04 = palVar65;
                    arr_store_si256(*(int **)((long)((ppVar24->field_4).trace)->trace_del_table +
                                             0x18),vH_02,t,seglen,d,s2Len);
                    uVar41 = uVar41 + 1;
                    lVar25 = lVar25 + 0x20;
                    palVar65 = b_04;
                    size = CONCAT44(uVar23,seglen);
                  }
                }
                alVar12 = ptr[uVar11];
                alVar17 = b_03[uVar11];
                alVar1 = b_04[uVar11];
                alVar2 = b_05[uVar11];
                for (iVar33 = 0; iVar33 < 0xf - (int)uVar10; iVar33 = iVar33 + 1) {
                  auVar48 = vperm2i128_avx2((undefined1  [32])alVar12,(undefined1  [32])alVar12,0x28
                                           );
                  alVar12 = (__m256i)vpalignr_avx2((undefined1  [32])alVar12,auVar48,0xe);
                  auVar48 = vperm2i128_avx2((undefined1  [32])alVar17,(undefined1  [32])alVar17,0x28
                                           );
                  alVar17 = (__m256i)vpalignr_avx2((undefined1  [32])alVar17,auVar48,0xe);
                  auVar48 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                  alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar48,0xe);
                  auVar48 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                  alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar48,0xe);
                }
                auVar5._2_2_ = uVar46;
                auVar5._0_2_ = uVar46;
                auVar5._4_2_ = uVar46;
                auVar5._6_2_ = uVar46;
                auVar5._8_2_ = uVar46;
                auVar5._10_2_ = uVar46;
                auVar5._12_2_ = uVar46;
                auVar5._14_2_ = uVar46;
                auVar5._16_2_ = uVar46;
                auVar5._18_2_ = uVar46;
                auVar5._20_2_ = uVar46;
                auVar5._22_2_ = uVar46;
                auVar5._24_2_ = uVar46;
                auVar5._26_2_ = uVar46;
                auVar5._28_2_ = uVar46;
                auVar5._30_2_ = uVar46;
                auVar48 = vpcmpgtw_avx2(auVar5,local_200);
                auVar14._2_2_ = sVar20;
                auVar14._0_2_ = sVar20;
                auVar14._4_2_ = sVar20;
                auVar14._6_2_ = sVar20;
                auVar14._8_2_ = sVar20;
                auVar14._10_2_ = sVar20;
                auVar14._12_2_ = sVar20;
                auVar14._14_2_ = sVar20;
                auVar14._16_2_ = sVar20;
                auVar14._18_2_ = sVar20;
                auVar14._20_2_ = sVar20;
                auVar14._22_2_ = sVar20;
                auVar14._24_2_ = sVar20;
                auVar14._26_2_ = sVar20;
                auVar14._28_2_ = sVar20;
                auVar14._30_2_ = sVar20;
                auVar55 = vpcmpgtw_avx2(local_220,auVar14);
                auVar48 = vpor_avx2(auVar55,auVar48);
                if ((((((((((((((((((((((((((((((((auVar48 >> 7 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0 &&
                                                 (auVar48 >> 0xf & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar48 >> 0x17 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar48 >> 0x1f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar48 >> 0x27 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar48 >> 0x2f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar48 >> 0x37 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar48 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar48 >> 0x47 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar48 >> 0x4f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar48 >> 0x57 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar48 >> 0x5f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar48 >> 0x67 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar48 >> 0x6f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar48 >> 0x77 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar48 >> 0x7f,0) == '\0') &&
                                  (auVar48 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar48 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar48 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar48 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar48 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar48 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar48 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar48 >> 0xbf,0) == '\0') &&
                          (auVar48 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar48 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar48 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar48 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar48 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar48 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar48 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    -1 < auVar48[0x1f]) {
                  uVar23 = vpextrw_avx(alVar12._16_16_,7);
                  sVar20 = (short)uVar23;
                  uVar23 = vpextrw_avx(alVar17._16_16_,7);
                  sVar26 = (short)uVar23;
                  uVar23 = vpextrw_avx(alVar1._16_16_,7);
                  sVar32 = (short)uVar23;
                  uVar23 = vpextrw_avx(alVar2._16_16_,7);
                  sVar35 = (short)uVar23;
                }
                else {
                  *(byte *)&ppVar24->flag = (byte)ppVar24->flag | 0x40;
                  sVar20 = 0;
                  sVar26 = 0;
                  sVar32 = 0;
                  sVar35 = 0;
                  iVar21 = 0;
                  uVar34 = 0;
                }
                ppVar24->score = (int)sVar20;
                ppVar24->end_query = uVar34;
                ppVar24->end_ref = iVar21;
                *(int *)(ppVar24->field_4).extra = (int)sVar26;
                ((ppVar24->field_4).stats)->similar = (int)sVar32;
                ((ppVar24->field_4).stats)->length = (int)sVar35;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(palVar65);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar24;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar30 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_stats_table_scan_profile_avx2_256_16",pcVar30);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile16.score;
    pvPm = (__m256i*)profile->profile16.matches;
    pvPs = (__m256i*)profile->profile16.similar;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi16(segLen), 2);
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            vGapperL = _mm256_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHpM = _mm256_slli_si256_rpl(vHpM, 2);
        vHpS = _mm256_slli_si256_rpl(vHpS, 2);
        vHpL = _mm256_slli_si256_rpl(vHpL, 2);
        vHp = _mm256_insert_epi16_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi16(vH, vGapO);
            vE_ext = _mm256_subs_epi16(vE, vGapE);
            case1 = _mm256_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm256_max_epi16(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi16(vEL, vOne);
            vGapper = _mm256_adds_epi16(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vF, vGapper),
                    _mm256_cmpeq_epi16(vF, vGapper));
            vF = _mm256_max_epi16(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi16(vHp, vW);
            vHpM = _mm256_adds_epi16(vHpM, vWM);
            vHpS = _mm256_adds_epi16(vHpS, vWS);
            vHpL = _mm256_adds_epi16(vHpL, vOne);
            case1 = _mm256_cmpgt_epi16(vE, vHp);
            vHt = _mm256_max_epi16(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHtM = _mm256_slli_si256_rpl(vHtM, 2);
        vHtS = _mm256_slli_si256_rpl(vHtS, 2);
        vHtL = _mm256_slli_si256_rpl(vHtL, 2);
        vHt = _mm256_insert_epi16_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi16(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi16(vGapper, vF),
                _mm256_cmpeq_epi16(vGapper, vF));
        vF = _mm256_max_epi16(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 2);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 2);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vFt, vF),
                    _mm256_cmpeq_epi16(vFt, vF));
            vF = _mm256_max_epi16(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vFM = _mm256_slli_si256_rpl(vFM, 2);
        vFS = _mm256_slli_si256_rpl(vFS, 2);
        vFL = _mm256_slli_si256_rpl(vFL, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi16(vF, vHt);
        vH = _mm256_max_epi16(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi16(vH, vGapO);
            vF_ext = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi16(vFL, vOne);
            vH = _mm256_max_epi16(vHp, vE);
            vH = _mm256_max_epi16(vH, vF);
            case1 = _mm256_cmpeq_epi16(vH, vHp);
            case2 = _mm256_cmpeq_epi16(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
                vHM = _mm256_slli_si256_rpl(vHM, 2);
                vHS = _mm256_slli_si256_rpl(vHS, 2);
                vHL = _mm256_slli_si256_rpl(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
            result->stats->rowcols->length_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 2);
            vHM = _mm256_slli_si256_rpl(vHM, 2);
            vHS = _mm256_slli_si256_rpl(vHS, 2);
            vHL = _mm256_slli_si256_rpl(vHL, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        matches = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
        similar = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
        length = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}